

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O3

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  size_t *psVar1;
  uint *puVar2;
  byte bVar3;
  char cVar4;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  CURLofft CVar9;
  int iVar10;
  fileinfo *pfVar11;
  char *pcVar12;
  long lVar13;
  void *pvVar14;
  curlfiletype cVar15;
  size_t __n;
  size_t sVar16;
  char *pcVar17;
  ulong uVar18;
  char *p;
  curl_off_t fsize;
  char *local_40;
  long local_38;
  
  sVar16 = size * nmemb;
  piVar5 = (int *)**(undefined8 **)((long)connptr + 0x1340);
  if (piVar5[3] == 0) {
    if ((sVar16 == 0) || (*piVar5 != 0)) {
      if (sVar16 == 0) {
        return 0;
      }
    }
    else {
      *piVar5 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    uVar18 = 0;
    do {
      bVar3 = buffer[uVar18];
      pfVar11 = *(fileinfo **)(piVar5 + 4);
      if (pfVar11 == (fileinfo *)0x0) {
        pfVar11 = Curl_fileinfo_alloc();
        *(fileinfo **)(piVar5 + 4) = pfVar11;
        if (pfVar11 != (fileinfo *)0x0) {
          pcVar12 = (char *)(*Curl_cmalloc)(0xa0);
          pfVar11 = *(fileinfo **)(piVar5 + 4);
          (pfVar11->info).b_data = pcVar12;
          if (pcVar12 != (char *)0x0) {
            (pfVar11->info).b_size = 0xa0;
            piVar5[8] = 0;
            piVar5[9] = 0;
            piVar5[6] = 0;
            goto LAB_0052c448;
          }
        }
LAB_0052cf96:
        piVar5[3] = 0x1b;
        goto LAB_0052c38c;
      }
      pcVar12 = (pfVar11->info).b_data;
LAB_0052c448:
      sVar6 = (pfVar11->info).b_used;
      (pfVar11->info).b_used = sVar6 + 1;
      pcVar12[sVar6] = bVar3;
      sVar6 = (pfVar11->info).b_size;
      if (sVar6 - 1 <= (pfVar11->info).b_used) {
        pcVar12 = (char *)(*Curl_crealloc)((pfVar11->info).b_data,sVar6 + 0xa0);
        if (pcVar12 == (char *)0x0) {
          Curl_fileinfo_cleanup(*(fileinfo **)(piVar5 + 4));
          piVar5[4] = 0;
          piVar5[5] = 0;
          goto LAB_0052cf96;
        }
        psVar1 = &(pfVar11->info).b_size;
        *psVar1 = *psVar1 + 0xa0;
        (pfVar11->info).b_data = pcVar12;
      }
      if (*piVar5 == 2) {
        switch(piVar5[1]) {
        case 0:
          uVar8 = piVar5[6] + 1;
          piVar5[6] = uVar8;
          if (uVar8 < 9) {
            __n = 0xc;
            pcVar12 = "0123456789-";
LAB_0052c9e5:
            pvVar14 = memchr(pcVar12,(int)(char)bVar3,__n);
            if (pvVar14 == (void *)0x0) goto LAB_0052cfac;
          }
          else {
            if ((uVar8 != 9) || (bVar3 != 0x20)) goto LAB_0052cfac;
            piVar5[1] = 1;
            piVar5[2] = 0;
          }
          break;
        case 1:
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (piVar5[2] == 1) {
            if (bVar3 != 0x20) {
              __n = 0xf;
              pcVar12 = "APM0123456789:";
              goto LAB_0052c9e5;
            }
            *(long *)(piVar5 + 0x10) = *(long *)(piVar5 + 8);
            (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            piVar5[1] = 2;
            piVar5[2] = 0;
LAB_0052c93c:
            piVar5[6] = 0;
          }
          else if (((piVar5[2] == 0) && (bVar3 != 9)) && (bVar3 != 0x20)) {
LAB_0052cdb9:
            piVar5[2] = 1;
          }
          break;
        case 2:
          iVar10 = piVar5[2];
          if (iVar10 != 1) goto LAB_0052c8e2;
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 == 0x20) {
            (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            pcVar12 = (pfVar11->info).b_data + *(long *)(piVar5 + 8);
            iVar10 = strcmp("<DIR>",pcVar12);
            if (iVar10 == 0) {
              (pfVar11->info).filetype = CURLFILETYPE_DIRECTORY;
              (pfVar11->info).size = 0;
              lVar13 = *(long *)(piVar5 + 4);
            }
            else {
              CVar9 = curlx_strtoofft(pcVar12,&local_40,10,&(pfVar11->info).size);
              if (CVar9 != CURL_OFFT_OK) goto LAB_0052cfac;
              lVar13 = *(long *)(piVar5 + 4);
              *(undefined4 *)(lVar13 + 8) = 0;
            }
            *(byte *)(lVar13 + 0x60) = *(byte *)(lVar13 + 0x60) | 0x40;
LAB_0052cce6:
            piVar5[6] = 0;
            piVar5[1] = 3;
            piVar5[2] = 0;
          }
          break;
        case 3:
          iVar10 = piVar5[2];
          if (iVar10 == 2) {
            if (bVar3 != 10) goto LAB_0052cfac;
            *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
          }
          else {
            if (iVar10 != 1) goto LAB_0052c8e2;
            piVar5[6] = piVar5[6] + 1;
            if (bVar3 != 10) {
              if (bVar3 == 0xd) {
                piVar5[2] = 2;
                (pfVar11->info).b_data[(pfVar11->info).b_used - 1] = '\0';
              }
              break;
            }
            *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
            (pfVar11->info).b_data[(pfVar11->info).b_used - 1] = '\0';
          }
          ftp_pl_insert_finfo((Curl_easy *)connptr,pfVar11);
          piVar5[1] = 0;
          piVar5[2] = 0;
        }
        goto switchD_0052c4be_default;
      }
      if (*piVar5 != 1) {
        sVar16 = sVar16 + 1;
        goto LAB_0052c38c;
      }
      switch(piVar5[1]) {
      case 0:
        if (piVar5[2] == 1) {
          uVar8 = piVar5[6];
          piVar5[6] = uVar8 + 1;
          if (bVar3 == 10) {
            (pfVar11->info).b_data[uVar8] = '\0';
            pcVar12 = (pfVar11->info).b_data;
            iVar10 = strncmp("total ",pcVar12,6);
            if (iVar10 == 0) {
              pcVar17 = pcVar12 + 7;
              for (pcVar12 = pcVar12 + 6; (cVar4 = *pcVar12, cVar4 == '\t' || (cVar4 == ' '));
                  pcVar12 = pcVar12 + 1) {
                pcVar17 = pcVar17 + 1;
              }
              while ((byte)(cVar4 - 0x30U) < 10) {
                cVar4 = *pcVar17;
                pcVar17 = pcVar17 + 1;
              }
              if (cVar4 == '\0') {
                piVar5[1] = 1;
                (pfVar11->info).b_used = 0;
                break;
              }
            }
            goto LAB_0052cfac;
          }
          if (bVar3 == 0xd) {
            piVar5[6] = uVar8;
            psVar1 = &(pfVar11->info).b_used;
            *psVar1 = *psVar1 - 1;
          }
          break;
        }
        if (piVar5[2] != 0) break;
        if (bVar3 == 0x74) {
          piVar5[2] = 1;
          piVar5[6] = piVar5[6] + 1;
          break;
        }
        piVar5[1] = 1;
        (pfVar11->info).b_used = 0;
        goto LAB_0052cf63;
      case 1:
        if (bVar3 < 100) {
          if (bVar3 < 0x62) {
            cVar15 = CURLFILETYPE_FILE;
            if (bVar3 != 0x2d) {
              if (bVar3 != 0x44) goto LAB_0052cfac;
              cVar15 = CURLFILETYPE_DOOR;
            }
          }
          else if (bVar3 == 0x62) {
            cVar15 = CURLFILETYPE_DEVICE_BLOCK;
          }
          else {
            if (bVar3 != 99) goto LAB_0052cfac;
            cVar15 = CURLFILETYPE_DEVICE_CHAR;
          }
        }
        else if (bVar3 < 0x70) {
          if (bVar3 == 100) {
            cVar15 = CURLFILETYPE_DIRECTORY;
          }
          else {
            if (bVar3 != 0x6c) goto LAB_0052cfac;
            cVar15 = CURLFILETYPE_SYMLINK;
          }
        }
        else if (bVar3 == 0x70) {
          cVar15 = CURLFILETYPE_NAMEDPIPE;
        }
        else {
          if (bVar3 != 0x73) goto LAB_0052cfac;
          cVar15 = CURLFILETYPE_SOCKET;
        }
        (pfVar11->info).filetype = cVar15;
        piVar5[1] = 2;
        piVar5[6] = 0;
        piVar5[8] = 1;
        piVar5[9] = 0;
        break;
      case 2:
        uVar8 = piVar5[6] + 1;
        piVar5[6] = uVar8;
        if (uVar8 < 10) {
          __n = 9;
          pcVar12 = "rwx-tTsS";
          goto LAB_0052c9e5;
        }
        if (uVar8 == 10) {
          if (bVar3 == 0x20) {
            (pfVar11->info).b_data[10] = '\0';
            lVar13 = *(long *)(piVar5 + 8);
            uVar8 = ftp_pl_get_permission((pfVar11->info).b_data + lVar13);
            if (uVar8 < 0x1000000) {
              lVar7 = *(long *)(piVar5 + 4);
              puVar2 = (uint *)(lVar7 + 0x60);
              *puVar2 = *puVar2 | 8;
              *(uint *)(lVar7 + 0x18) = uVar8;
              *(long *)(piVar5 + 0x12) = lVar13;
              goto LAB_0052cce6;
            }
          }
          goto LAB_0052cfac;
        }
        break;
      case 3:
        iVar10 = piVar5[2];
        if (iVar10 == 1) {
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 == 0x20) {
            (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            lVar13 = strtol((pfVar11->info).b_data + *(long *)(piVar5 + 8),&local_40,10);
            if ((*local_40 == '\0') && (lVar13 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
              lVar7 = *(long *)(piVar5 + 4);
              puVar2 = (uint *)(lVar7 + 0x60);
              *puVar2 = *puVar2 | 0x80;
              *(long *)(lVar7 + 0x30) = lVar13;
            }
            piVar5[6] = 0;
            piVar5[8] = 0;
            piVar5[9] = 0;
            piVar5[1] = 4;
            piVar5[2] = 0;
          }
          else if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_0052cfac;
        }
        else {
LAB_0052c8aa:
          if ((iVar10 == 0) && (bVar3 != 0x20)) {
            if ((byte)(bVar3 - 0x30) < 10) goto LAB_0052c8f4;
            goto LAB_0052cfac;
          }
        }
        break;
      case 4:
        iVar10 = piVar5[2];
        if (iVar10 == 1) {
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 == 0x20) {
            (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            *(undefined8 *)(piVar5 + 0xc) = *(undefined8 *)(piVar5 + 8);
            piVar5[1] = 5;
            piVar5[2] = 0;
LAB_0052c88e:
            piVar5[8] = 0;
            piVar5[9] = 0;
            goto LAB_0052c93c;
          }
        }
        else {
LAB_0052c8e2:
          if (iVar10 == 0) goto switchD_0052c6d8_caseD_0;
        }
        break;
      case 5:
        iVar10 = piVar5[2];
        if (iVar10 != 1) goto LAB_0052c8e2;
        iVar10 = piVar5[6];
        piVar5[6] = iVar10 + 1U;
        if (bVar3 == 0x20) {
          (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
          *(undefined8 *)(piVar5 + 0xe) = *(undefined8 *)(piVar5 + 8);
          piVar5[1] = 6;
          piVar5[2] = 0;
          goto LAB_0052c88e;
        }
        break;
      case 6:
        iVar10 = piVar5[2];
        if (iVar10 != 1) goto LAB_0052c8aa;
        iVar10 = piVar5[6];
        piVar5[6] = iVar10 + 1U;
        if (bVar3 == 0x20) {
          (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
          CVar9 = curlx_strtoofft((pfVar11->info).b_data + *(long *)(piVar5 + 8),&local_40,10,
                                  &local_38);
          if (CVar9 == CURL_OFFT_OK) {
            if (local_38 + 0x7fffffffffffffffU < 0xfffffffffffffffe && *local_40 == '\0') {
              lVar13 = *(long *)(piVar5 + 4);
              puVar2 = (uint *)(lVar13 + 0x60);
              *puVar2 = *puVar2 | 0x40;
              *(long *)(lVar13 + 0x28) = local_38;
            }
            piVar5[6] = 0;
            piVar5[8] = 0;
            piVar5[9] = 0;
            piVar5[1] = 7;
            piVar5[2] = 0;
          }
        }
        else if (9 < (byte)(bVar3 - 0x30)) goto LAB_0052cfac;
        break;
      case 7:
        switch(piVar5[2]) {
        case 0:
          if (bVar3 != 0x20) {
            if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf)))
            goto LAB_0052cfac;
            goto LAB_0052c8f4;
          }
          break;
        case 1:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 == 0x20) {
LAB_0052cc40:
            piVar5[2] = 2;
          }
          else {
LAB_0052cc4e:
            if ((0x19 < (byte)(bVar3 + 0x9f) && 9 < (byte)(bVar3 - 0x30)) &&
               (bVar3 != 0x2e && (byte)(bVar3 + 0xa5) < 0xe6)) goto LAB_0052cfac;
          }
          break;
        case 2:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 != 0x20) {
            if (((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a))
            goto LAB_0052cd8a;
            goto LAB_0052cfac;
          }
          break;
        case 3:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 != 0x20) goto LAB_0052cc4e;
LAB_0052cdc7:
          piVar5[2] = 4;
          break;
        case 4:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 != 0x20) {
            if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf)))
            goto LAB_0052cfac;
            piVar5[2] = 5;
          }
          break;
        case 5:
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 == 0x20) {
            (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            *(undefined8 *)(piVar5 + 0x10) = *(undefined8 *)(piVar5 + 8);
            if ((pfVar11->info).filetype == CURLFILETYPE_SYMLINK) {
              piVar5[1] = 9;
              piVar5[2] = 0;
            }
            else {
              piVar5[1] = 8;
              piVar5[2] = 0;
            }
          }
          else if (((((byte)(bVar3 - 0x3a) < 0xf6) && ((byte)((bVar3 & 0xdf) + 0xa5) < 0xe6)) &&
                   (bVar3 != 0x2e)) && (bVar3 != 0x3a)) goto LAB_0052cfac;
        }
        break;
      case 8:
        iVar10 = piVar5[2];
        if (iVar10 == 2) {
          if (bVar3 != 10) goto LAB_0052cfac;
          (pfVar11->info).b_data[((ulong)(uint)piVar5[6] - 1) + *(long *)(piVar5 + 8)] = '\0';
        }
        else {
          if (iVar10 != 1) goto LAB_0052c8e2;
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 != 10) {
            if (bVar3 == 0xd) goto LAB_0052cc40;
            break;
          }
          (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
        }
        *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
        piVar5[1] = 1;
        ftp_pl_insert_finfo((Curl_easy *)connptr,pfVar11);
        break;
      case 9:
        switch(piVar5[2]) {
        case 0:
switchD_0052c6d8_caseD_0:
          if (bVar3 != 0x20) {
LAB_0052c8f4:
            *(size_t *)(piVar5 + 8) = (pfVar11->info).b_used - 1;
            piVar5[6] = 1;
            piVar5[2] = 1;
          }
          break;
        case 1:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 == 0x20) goto LAB_0052cc40;
          if ((bVar3 == 10) || (bVar3 == 0xd)) goto LAB_0052cfac;
          break;
        case 2:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 != 0x2d) goto LAB_0052cda3;
LAB_0052cd8a:
          piVar5[2] = 3;
          break;
        case 3:
          piVar5[6] = piVar5[6] + 1;
          if (bVar3 == 0x3e) goto LAB_0052cdc7;
LAB_0052cda3:
          if ((bVar3 != 10) && (bVar3 != 0xd)) goto LAB_0052cdb9;
          goto LAB_0052cfac;
        case 4:
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 != 0x20) goto LAB_0052cda3;
          piVar5[2] = 5;
          (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 4) + *(long *)(piVar5 + 8)] = '\0';
          *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
          piVar5[6] = 0;
          piVar5[8] = 0;
          piVar5[9] = 0;
          break;
        case 5:
          if ((bVar3 == 10) || (bVar3 == 0xd)) goto LAB_0052cfac;
          piVar5[2] = 6;
          *(size_t *)(piVar5 + 8) = (pfVar11->info).b_used - 1;
          piVar5[6] = 1;
          break;
        case 6:
          iVar10 = piVar5[6];
          piVar5[6] = iVar10 + 1U;
          if (bVar3 == 10) {
            (pfVar11->info).b_data[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
LAB_0052cf41:
            *(undefined8 *)(piVar5 + 0x14) = *(undefined8 *)(piVar5 + 8);
            ftp_pl_insert_finfo((Curl_easy *)connptr,pfVar11);
            piVar5[1] = 1;
          }
          else if (bVar3 == 0xd) {
            piVar5[2] = 7;
          }
          break;
        case 7:
          if (bVar3 == 10) {
            (pfVar11->info).b_data[((ulong)(uint)piVar5[6] - 1) + *(long *)(piVar5 + 8)] = '\0';
            goto LAB_0052cf41;
          }
LAB_0052cfac:
          piVar5[3] = 0x57;
          goto LAB_0052c38c;
        }
      }
switchD_0052c4be_default:
      uVar18 = uVar18 + 1;
LAB_0052cf63:
    } while (uVar18 < sVar16);
  }
  else {
LAB_0052c38c:
    if (*(fileinfo **)(piVar5 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar5 + 4));
      piVar5[4] = 0;
      piVar5[5] = 0;
    }
  }
  return sVar16;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard.protdata;
  struct ftp_parselist_data *parser = ftpwc->parser;
  struct fileinfo *infop;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->file_data->info.b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->info.b_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->file_data->info.b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    infop = parser->file_data;
    finfo = &infop->info;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_cleanup(parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
    }

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              while(ISBLANK(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              finfo->b_used = 0;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(!curlx_strtoofft(finfo->b_data + parser->item_offset,
                                &p, 10, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                 fsize != CURL_OFF_T_MIN) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              if(curlx_strtoofft(finfo->b_data +
                                 parser->item_offset,
                                 &endptr, 10, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}